

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall
capnp::_::WirePointer::setKindAndTarget
          (WirePointer *this,Kind kind,word *target,SegmentBuilder *segment)

{
  bool bVar1;
  SegmentWordCount SVar2;
  word *pwVar3;
  Fault local_158;
  Fault f_3;
  word *local_148;
  DebugExpression<unsigned_long> local_140;
  undefined1 local_138 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_3;
  Fault f_2;
  word *local_100;
  DebugExpression<unsigned_long> local_f8;
  undefined1 local_f0 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_2;
  Fault f_1;
  WirePointer *local_b8;
  DebugExpression<unsigned_long> local_b0;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  Fault local_70;
  Fault f;
  WirePointer *local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  SegmentBuilder *segment_local;
  word *target_local;
  Kind kind_local;
  WirePointer *this_local;
  
  local_60 = this;
  _kjCondition._32_8_ = segment;
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&local_60);
  f.exception = (Exception *)SegmentReader::getStartPtr((SegmentReader *)_kjCondition._32_8_);
  kj::_::DebugExpression<unsigned_long>::operator>=
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_50,&local_58,(unsigned_long *)&f
            );
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xaa,FAILED,
               "reinterpret_cast<uintptr_t>(this) >= reinterpret_cast<uintptr_t>(segment->getStartPtr())"
               ,"_kjCondition,",(DebugComparison<unsigned_long,_unsigned_long> *)local_50);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  local_b8 = this;
  local_b0 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&local_b8);
  pwVar3 = SegmentReader::getStartPtr((SegmentReader *)_kjCondition._32_8_);
  SVar2 = SegmentReader::getSize((SegmentReader *)_kjCondition._32_8_);
  f_1.exception = (Exception *)(pwVar3 + SVar2);
  kj::_::DebugExpression<unsigned_long>::operator<
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_a8,&local_b0,
             (unsigned_long *)&f_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              ((Fault *)&_kjCondition_2.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xac,FAILED,
               "reinterpret_cast<uintptr_t>(this) < reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize())"
               ,"_kjCondition,",(DebugComparison<unsigned_long,_unsigned_long> *)local_a8);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
  }
  local_100 = target;
  local_f8 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&local_100);
  f_2.exception = (Exception *)SegmentReader::getStartPtr((SegmentReader *)_kjCondition._32_8_);
  kj::_::DebugExpression<unsigned_long>::operator>=
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_f0,&local_f8,
             (unsigned_long *)&f_2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              ((Fault *)&_kjCondition_3.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xae,FAILED,
               "reinterpret_cast<uintptr_t>(target) >= reinterpret_cast<uintptr_t>(segment->getStartPtr())"
               ,"_kjCondition,",(DebugComparison<unsigned_long,_unsigned_long> *)local_f0);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_3.result);
  }
  local_148 = target;
  local_140 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&local_148);
  pwVar3 = SegmentReader::getStartPtr((SegmentReader *)_kjCondition._32_8_);
  SVar2 = SegmentReader::getSize((SegmentReader *)_kjCondition._32_8_);
  f_3.exception = (Exception *)(pwVar3 + SVar2);
  kj::_::DebugExpression<unsigned_long>::operator<=
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_138,&local_140,
             (unsigned_long *)&f_3);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xb0,FAILED,
               "reinterpret_cast<uintptr_t>(target) <= reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize())"
               ,"_kjCondition,",(DebugComparison<unsigned_long,_unsigned_long> *)local_138);
    kj::_::Debug::Fault::fatal(&local_158);
  }
  DirectWireValue<unsigned_int>::set
            (&this->offsetAndKind,((int)((long)target - (long)this >> 3) + -1) * 4 | kind);
  return;
}

Assistant:

KJ_ALWAYS_INLINE(void setKindAndTarget(Kind kind, word* target, SegmentBuilder* segment)) {
    // Check that the target is really in the same segment, otherwise subtracting pointers is
    // undefined behavior.  As it turns out, it's undefined behavior that actually produces
    // unexpected results in a real-world situation that actually happened:  At one time,
    // OrphanBuilder's "tag" (a WirePointer) was allowed to be initialized as if it lived in
    // a particular segment when in fact it does not.  On 32-bit systems, where words might
    // only be 32-bit aligned, it's possible that the difference between `this` and `target` is
    // not a whole number of words.  But clang optimizes:
    //     (target - (word*)this - 1) << 2
    // to:
    //     (((ptrdiff_t)target - (ptrdiff_t)this - 8) >> 1)
    // So now when the pointers are not aligned the same, we can end up corrupting the bottom
    // two bits, where `kind` is stored.  For example, this turns a struct into a far pointer.
    // Ouch!
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(this) >=
                reinterpret_cast<uintptr_t>(segment->getStartPtr()));
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(this) <
                reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize()));
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(target) >=
                reinterpret_cast<uintptr_t>(segment->getStartPtr()));
    KJ_DREQUIRE(reinterpret_cast<uintptr_t>(target) <=
                reinterpret_cast<uintptr_t>(segment->getStartPtr() + segment->getSize()));
    offsetAndKind.set((static_cast<uint32_t>(target - reinterpret_cast<word*>(this) - 1) << 2) | kind);
  }